

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::crypto_receive_buffer::reset(crypto_receive_buffer *this,int packet_size)

{
  int iVar1;
  receive_buffer *prVar2;
  
  if (this->m_recv_pos != 0x7fffffff) {
    if (this->m_packet_size < this->m_connection_buffer->m_recv_end) {
      cut(this,this->m_packet_size,packet_size,0);
      return;
    }
    this->m_packet_size = packet_size;
    packet_size = this->m_connection_buffer->m_packet_size - this->m_recv_pos;
    this->m_recv_pos = 0;
  }
  prVar2 = this->m_connection_buffer;
  iVar1 = prVar2->m_packet_size;
  if (iVar1 < prVar2->m_recv_end) {
    prVar2->m_recv_start = prVar2->m_recv_start + iVar1;
    prVar2->m_recv_pos = prVar2->m_recv_pos - iVar1;
  }
  else {
    prVar2->m_recv_pos = 0;
    prVar2->m_recv_start = 0;
    prVar2->m_recv_end = 0;
  }
  prVar2->m_packet_size = packet_size;
  return;
}

Assistant:

void crypto_receive_buffer::reset(int packet_size)
{
	if (m_recv_pos != INT_MAX)
	{
		if (m_connection_buffer.m_recv_end > m_packet_size)
		{
			cut(m_packet_size, packet_size);
			return;
		}
		m_packet_size = packet_size;
		packet_size = m_connection_buffer.packet_size() - m_recv_pos;
		m_recv_pos = 0;
	}
	m_connection_buffer.reset(packet_size);
}